

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O2

void __thiscall
sisl::utility::isosurface::processFaces
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                *faces)

{
  int j;
  int iVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  pointer ptVar4;
  int vIndex;
  vertex3 v;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> faceMap;
  _Rb_tree_color local_84;
  vertex3 local_80;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = (vMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(vMap->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    vertex3::vertex3(&local_80,(vertex3 *)&p_Var3[1]._M_parent);
    local_84 = p_Var3[1]._M_color;
    iVar1 = ply_mesh::add_vertex(&this->plyfile,&local_80);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,(key_type *)&local_84);
    *pmVar2 = iVar1;
    vertex3::~vertex3(&local_80);
  }
  for (ptVar4 = (faces->
                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ptVar4 != (faces->
                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ptVar4 = ptVar4 + 1) {
    local_80.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_
         = (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Head_base<0UL,_int,_false>.
           _M_head_impl;
    local_80.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         *(double **)
          &(ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,
                        (key_type *)
                        &local_80.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    iVar1 = *pmVar2;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,
                        (key_type *)
                        ((long)&local_80.p.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + 4));
    j = *pmVar2;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,(key_type *)&local_80);
    ply_mesh::add_triangle(&this->plyfile,iVar1,j,*pmVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void processFaces(
            std::map<int, sisl::vertex3 > *vMap,
            const std::vector<std::tuple<int,int,int>> &faces){
         std::map<int, int> faceMap;

        for(auto itr = vMap->begin(); itr != vMap->end(); ++itr) {
            sisl::vertex3 v = itr->second;
            int vIndex = itr->first;

            faceMap[vIndex] = plyfile.add_vertex(v);
        }

        for(auto itr = faces.begin(); itr != faces.end(); ++itr) {
            std::tuple<int, int, int> t = *itr;

            int i1 = faceMap[std::get<0>(t)];
            int i2 = faceMap[std::get<1>(t)];
            int i3 = faceMap[std::get<2>(t)];

            plyfile.add_triangle(i1,i2,i3);
        }
    }